

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

Logger * __thiscall el::Logger::operator=(Logger *this,Logger *logger)

{
  Logger *logger_local;
  Logger *this_local;
  
  if (logger != this) {
    el::base::utils::safeDelete<el::base::TypedConfigurations>(&this->m_typedConfigurations);
    std::__cxx11::string::operator=((string *)&this->m_id,(string *)&logger->m_id);
    this->m_typedConfigurations = logger->m_typedConfigurations;
    std::__cxx11::string::operator=
              ((string *)&this->m_parentApplicationName,(string *)&logger->m_parentApplicationName);
    this->m_isConfigured = (bool)(logger->m_isConfigured & 1);
    Configurations::operator=(&this->m_configurations,&logger->m_configurations);
    el::base::utils::std::
    unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
    ::operator=(&this->m_unflushedCount,&logger->m_unflushedCount);
    this->m_logStreamsReference = logger->m_logStreamsReference;
  }
  return this;
}

Assistant:

Logger& Logger::operator=(const Logger& logger) {
  if (&logger != this) {
    base::utils::safeDelete(m_typedConfigurations);
    m_id = logger.m_id;
    m_typedConfigurations = logger.m_typedConfigurations;
    m_parentApplicationName = logger.m_parentApplicationName;
    m_isConfigured = logger.m_isConfigured;
    m_configurations = logger.m_configurations;
    m_unflushedCount = logger.m_unflushedCount;
    m_logStreamsReference = logger.m_logStreamsReference;
  }
  return *this;
}